

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::FieldDescriptor::CopyTo(FieldDescriptor *this,FieldDescriptorProto *proto)

{
  string_view value;
  string_view value_00;
  FieldDescriptorProto *pFVar1;
  bool bVar2;
  int value_01;
  FieldDescriptorProto_Label FVar3;
  Type TVar4;
  Edition EVar5;
  FieldDescriptorProto_Type FVar6;
  CppType CVar7;
  FieldOptions_CType value_02;
  uint32_t *puVar8;
  Arena *pAVar9;
  FileDescriptor *pFVar10;
  Descriptor *pDVar11;
  string *psVar12;
  EnumDescriptor *pEVar13;
  OneofDescriptor *pOVar14;
  char *pcVar15;
  FieldOptions *pFVar16;
  FieldOptions *pFVar17;
  int __c;
  AlphaNum *a;
  undefined1 local_1c8 [48];
  AlphaNum local_198;
  string_view local_168;
  AlphaNum local_158;
  string_view local_128;
  AlphaNum local_118;
  string_view local_e8;
  string_view local_d8;
  FieldDescriptorProto *local_c8;
  FieldDescriptorProto *proto_local;
  FieldDescriptor *this_local;
  char *local_b0;
  string_view *local_a8;
  FieldDescriptorProto *local_a0;
  size_t local_98;
  char *local_90;
  string_view *local_88;
  FieldDescriptorProto *local_80;
  char *local_78;
  FieldDescriptorProto *local_70;
  char *local_68;
  FieldDescriptorProto *local_60;
  char *local_58;
  FieldDescriptorProto *local_50;
  AlphaNum *local_48;
  FieldDescriptorProto *local_40;
  anon_union_80_1_493b367e_for_FieldDescriptorProto_32 *local_38;
  anon_union_80_1_493b367e_for_FieldDescriptorProto_32 *local_30;
  anon_union_80_1_493b367e_for_FieldDescriptorProto_32 *local_28;
  anon_union_80_1_493b367e_for_FieldDescriptorProto_32 *local_20;
  anon_union_80_1_493b367e_for_FieldDescriptorProto_32 *local_18;
  anon_union_80_1_493b367e_for_FieldDescriptorProto_32 *local_10;
  
  local_c8 = proto;
  proto_local = (FieldDescriptorProto *)this;
  local_d8 = name(this);
  local_a8 = &local_d8;
  local_10 = &proto->field_0;
  local_a0 = proto;
  puVar8 = internal::HasBits<1>::operator[](&(proto->field_0)._impl_._has_bits_,0);
  *puVar8 = *puVar8 | 1;
  this_local = (FieldDescriptor *)local_a8->_M_len;
  local_b0 = local_a8->_M_str;
  pAVar9 = MessageLite::GetArena((MessageLite *)proto);
  value._M_str = local_b0;
  value._M_len = (size_t)this_local;
  internal::ArenaStringPtr::Set(&(proto->field_0)._impl_.name_,value,pAVar9);
  pFVar1 = local_c8;
  value_01 = number(this);
  FieldDescriptorProto::set_number(pFVar1,value_01);
  pFVar1 = local_c8;
  if (((byte)this->field_0x1 >> 2 & 1) != 0) {
    local_e8 = json_name(this);
    local_80 = pFVar1;
    local_88 = &local_e8;
    local_18 = &pFVar1->field_0;
    puVar8 = internal::HasBits<1>::operator[](&(pFVar1->field_0)._impl_._has_bits_,0);
    *puVar8 = *puVar8 | 0x10;
    local_98 = local_88->_M_len;
    local_90 = local_88->_M_str;
    pAVar9 = MessageLite::GetArena((MessageLite *)pFVar1);
    value_00._M_str = local_90;
    value_00._M_len = local_98;
    internal::ArenaStringPtr::Set(&(pFVar1->field_0)._impl_.json_name_,value_00,pAVar9);
  }
  if (((byte)this->field_0x1 >> 1 & 1) != 0) {
    FieldDescriptorProto::set_proto3_optional(local_c8,true);
  }
  bVar2 = is_required(this);
  if (bVar2) {
    pFVar10 = file(this);
    EVar5 = FileDescriptor::edition(pFVar10);
    bVar2 = anon_unknown_24::IsLegacyEdition(EVar5);
    pFVar1 = local_c8;
    if (bVar2) goto LAB_001554f1;
    FVar3 = absl::lts_20250127::implicit_cast<int>(1);
    FieldDescriptorProto::set_label(pFVar1,FVar3);
  }
  else {
LAB_001554f1:
    pFVar1 = local_c8;
    FVar3 = absl::lts_20250127::implicit_cast<int>((uint)((byte)this->field_0x1 >> 6));
    FieldDescriptorProto::set_label(pFVar1,FVar3);
  }
  TVar4 = type(this);
  if (TVar4 == TYPE_GROUP) {
    pFVar10 = file(this);
    EVar5 = FileDescriptor::edition(pFVar10);
    bVar2 = anon_unknown_24::IsLegacyEdition(EVar5);
    pFVar1 = local_c8;
    if (!bVar2) {
      FVar6 = absl::lts_20250127::implicit_cast<int>(0xb);
      a = (AlphaNum *)(ulong)FVar6;
      FieldDescriptorProto::set_type(pFVar1,FVar6);
      goto LAB_001555a9;
    }
  }
  pFVar1 = local_c8;
  TVar4 = type(this);
  FVar6 = absl::lts_20250127::implicit_cast<int>(TVar4);
  a = (AlphaNum *)(ulong)FVar6;
  FieldDescriptorProto::set_type(pFVar1,FVar6);
LAB_001555a9:
  bVar2 = is_extension(this);
  if (bVar2) {
    pDVar11 = containing_type(this);
    pFVar1 = local_c8;
    if ((*(ushort *)&pDVar11->field_0x1 >> 1 & 1) == 0) {
      local_70 = local_c8;
      local_78 = ".";
      local_20 = &local_c8->field_0;
      puVar8 = internal::HasBits<1>::operator[](&(local_c8->field_0)._impl_._has_bits_,0);
      pcVar15 = local_78;
      *puVar8 = *puVar8 | 2;
      pAVar9 = MessageLite::GetArena((MessageLite *)pFVar1);
      internal::ArenaStringPtr::Set(&(pFVar1->field_0)._impl_.extendee_,pcVar15,pAVar9);
    }
    psVar12 = FieldDescriptorProto::mutable_extendee_abi_cxx11_(local_c8);
    pDVar11 = containing_type(this);
    local_128 = Descriptor::full_name(pDVar11);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_118,local_128);
    a = &local_118;
    absl::lts_20250127::StrAppend(psVar12,a);
  }
  CVar7 = cpp_type(this);
  if (CVar7 == CPPTYPE_MESSAGE) {
    pDVar11 = message_type(this);
    if ((*(ushort *)&pDVar11->field_0x1 & 1) != 0) {
      FieldDescriptorProto::clear_type(local_c8);
    }
    pDVar11 = message_type(this);
    pFVar1 = local_c8;
    if ((*(ushort *)&pDVar11->field_0x1 >> 1 & 1) == 0) {
      local_50 = local_c8;
      local_58 = ".";
      local_30 = &local_c8->field_0;
      puVar8 = internal::HasBits<1>::operator[](&(local_c8->field_0)._impl_._has_bits_,0);
      pcVar15 = local_58;
      *puVar8 = *puVar8 | 4;
      pAVar9 = MessageLite::GetArena((MessageLite *)pFVar1);
      internal::ArenaStringPtr::Set(&(pFVar1->field_0)._impl_.type_name_,pcVar15,pAVar9);
    }
    psVar12 = FieldDescriptorProto::mutable_type_name_abi_cxx11_(local_c8);
    pDVar11 = message_type(this);
    local_168 = Descriptor::full_name(pDVar11);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_158,local_168);
    a = &local_158;
    absl::lts_20250127::StrAppend(psVar12,a);
  }
  else {
    CVar7 = cpp_type(this);
    if (CVar7 == CPPTYPE_ENUM) {
      pEVar13 = enum_type(this);
      pFVar1 = local_c8;
      if (((byte)pEVar13->field_0x1 >> 1 & 1) == 0) {
        local_60 = local_c8;
        local_68 = ".";
        local_28 = &local_c8->field_0;
        puVar8 = internal::HasBits<1>::operator[](&(local_c8->field_0)._impl_._has_bits_,0);
        pcVar15 = local_68;
        *puVar8 = *puVar8 | 4;
        pAVar9 = MessageLite::GetArena((MessageLite *)pFVar1);
        internal::ArenaStringPtr::Set(&(pFVar1->field_0)._impl_.type_name_,pcVar15,pAVar9);
      }
      psVar12 = FieldDescriptorProto::mutable_type_name_abi_cxx11_(local_c8);
      pEVar13 = enum_type(this);
      local_1c8._32_16_ = (undefined1  [16])EnumDescriptor::full_name(pEVar13);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_198,(string_view)local_1c8._32_16_);
      a = &local_198;
      absl::lts_20250127::StrAppend(psVar12,a);
    }
  }
  bVar2 = has_default_value(this);
  pFVar1 = local_c8;
  if (bVar2) {
    DefaultValueAsString_abi_cxx11_((string *)local_1c8,this,false);
    local_40 = pFVar1;
    local_38 = &pFVar1->field_0;
    local_48 = (AlphaNum *)local_1c8;
    puVar8 = internal::HasBits<1>::operator[](&(local_38->_impl_)._has_bits_,0);
    a = local_48;
    *(byte *)puVar8 = (byte)*puVar8 | 8;
    pAVar9 = MessageLite::GetArena((MessageLite *)pFVar1);
    internal::ArenaStringPtr::Set(&(pFVar1->field_0)._impl_.default_value_,(string *)a,pAVar9);
    std::__cxx11::string::~string((string *)local_1c8);
  }
  pOVar14 = containing_oneof(this);
  if ((pOVar14 != (OneofDescriptor *)0x0) && (bVar2 = is_extension(this), pFVar1 = local_c8, !bVar2)
     ) {
    pOVar14 = containing_oneof(this);
    pcVar15 = OneofDescriptor::index(pOVar14,(char *)a,__c);
    FieldDescriptorProto::set_oneof_index(pFVar1,(int32_t)pcVar15);
  }
  pFVar16 = options(this);
  pFVar17 = FieldOptions::default_instance();
  if (pFVar16 != pFVar17) {
    pFVar16 = options(this);
    pFVar17 = FieldDescriptorProto::mutable_options(local_c8);
    FieldOptions::operator=(pFVar17,pFVar16);
  }
  bVar2 = has_legacy_proto_ctype(this);
  if (bVar2) {
    pFVar16 = FieldDescriptorProto::mutable_options(local_c8);
    value_02 = legacy_proto_ctype(this);
    FieldOptions::set_ctype(pFVar16,value_02);
  }
  anon_unknown_24::RestoreFeaturesToOptions<google::protobuf::FieldDescriptorProto>
            (this->proto_features_,local_c8);
  return;
}

Assistant:

void FieldDescriptor::CopyTo(FieldDescriptorProto* proto) const {
  proto->set_name(name());
  proto->set_number(number());
  if (has_json_name_) {
    proto->set_json_name(json_name());
  }
  if (proto3_optional_) {
    proto->set_proto3_optional(true);
  }
  // Some compilers do not allow static_cast directly between two enum types,
  // so we must cast to int first.
  if (is_required() && !IsLegacyEdition(file()->edition())) {
    // Editions files have no required keyword, and we only set this label
    // during descriptor build.
    proto->set_label(static_cast<FieldDescriptorProto::Label>(
        absl::implicit_cast<int>(LABEL_OPTIONAL)));
  } else {
    proto->set_label(static_cast<FieldDescriptorProto::Label>(
        absl::implicit_cast<int>(static_cast<Label>(label_))));
  }
  if (type() == TYPE_GROUP && !IsLegacyEdition(file()->edition())) {
    // Editions files have no group keyword, and we only set this label
    // during descriptor build.
    proto->set_type(static_cast<FieldDescriptorProto::Type>(
        absl::implicit_cast<int>(TYPE_MESSAGE)));
  } else {
    proto->set_type(static_cast<FieldDescriptorProto::Type>(
        absl::implicit_cast<int>(type())));
  }

  if (is_extension()) {
    if (!containing_type()->is_unqualified_placeholder_) {
      proto->set_extendee(".");
    }
    absl::StrAppend(proto->mutable_extendee(), containing_type()->full_name());
  }

  if (cpp_type() == CPPTYPE_MESSAGE) {
    if (message_type()->is_placeholder_) {
      // We don't actually know if the type is a message type.  It could be
      // an enum.
      proto->clear_type();
    }

    if (!message_type()->is_unqualified_placeholder_) {
      proto->set_type_name(".");
    }
    absl::StrAppend(proto->mutable_type_name(), message_type()->full_name());
  } else if (cpp_type() == CPPTYPE_ENUM) {
    if (!enum_type()->is_unqualified_placeholder_) {
      proto->set_type_name(".");
    }
    absl::StrAppend(proto->mutable_type_name(), enum_type()->full_name());
  }

  if (has_default_value()) {
    proto->set_default_value(DefaultValueAsString(false));
  }

  if (containing_oneof() != nullptr && !is_extension()) {
    proto->set_oneof_index(containing_oneof()->index());
  }

  if (&options() != &FieldOptions::default_instance()) {
    *proto->mutable_options() = options();
  }
  if (has_legacy_proto_ctype()) {
    proto->mutable_options()->set_ctype(
        static_cast<FieldOptions::CType>(legacy_proto_ctype()));
  }

  RestoreFeaturesToOptions(proto_features_, proto);
}